

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

ProcessorInstanceRef * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::getOrCreateImplicitProcessorInstance
          (QualifiedIdentifierResolver *this,Context *c,ProcessorBase *processor,
          pool_ptr<soul::AST::Expression> *arguments)

{
  ModuleBase *pMVar1;
  pointer ppVar2;
  Expression *pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Allocator *this_00;
  undefined8 uVar4;
  pool_ptr<soul::AST::Expression> *ppVar5;
  int iVar6;
  ProcessorInstance *newInstance;
  UnqualifiedName *pUVar7;
  ProcessorRef *pPVar8;
  QualifiedIdentifierResolver *args;
  Identifier *in_R9;
  ProcessorInstanceRef *unaff_R12;
  Graph *this_01;
  bool bVar9;
  bool bVar10;
  string_view newString;
  pool_ref<soul::AST::ProcessorInstance> i;
  string signature;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_188;
  Graph *local_150;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  pool_ptr<soul::AST::Expression> *local_108;
  ASTUtilities *local_100;
  pointer local_f8;
  Scope local_f0;
  string local_e8;
  string local_c8;
  pool_ptr<soul::AST::Expression> local_a8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_a8 = (pool_ptr<soul::AST::Expression>)arguments->object;
  args = (QualifiedIdentifierResolver *)arguments;
  AST::CommaSeparatedList::getAsExpressionList(&local_188,&local_a8);
  local_100 = (ASTUtilities *)&(processor->super_ModuleBase).specialisationParams;
  ASTUtilities::
  getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
            (&local_e8,local_100,
             (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
              *)&local_188,
             (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)args);
  local_188.numActive = 0;
  if (4 < local_188.numAllocated) {
    if (local_188.items != (pool_ref<soul::AST::Expression> *)0x0) {
      operator_delete__(local_188.items);
    }
    local_188.items = (pool_ref<soul::AST::Expression> *)local_188.space;
    local_188.numAllocated = 4;
  }
  pMVar1 = (this->currentModule).object;
  if (pMVar1 == (ModuleBase *)0x0) {
    local_150 = (Graph *)0x0;
  }
  else {
    args = (QualifiedIdentifierResolver *)0x0;
    local_150 = (Graph *)__dynamic_cast(pMVar1,&AST::ModuleBase::typeinfo,&AST::Graph::typeinfo);
  }
  local_108 = arguments;
  if (local_150 == (Graph *)0x0) {
    throwInternalCompilerError
              ("currentGraph != nullptr","getOrCreateImplicitProcessorInstance",0x409);
  }
  ppVar2 = (local_150->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f8 = (local_150->processorInstances).
             super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = ppVar2 == local_f8;
  while (!bVar9) {
    local_148._0_8_ = ppVar2->object;
    pEVar3 = (((ProcessorInstance *)local_148._0_8_)->targetProcessor).object;
    if (pEVar3 == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[6])(local_128);
    uVar4 = local_128._0_8_;
    if ((ProcessorBase *)local_128._0_8_ == processor) {
      local_f0._vptr_Scope =
           (_func_int **)((pool_ptr<soul::AST::Expression> *)(local_148._0_8_ + 0x38))->object;
      AST::CommaSeparatedList::getAsExpressionList
                (&local_188,(pool_ptr<soul::AST::Expression> *)&local_f0);
      ASTUtilities::
      getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
                (&local_c8,local_100,
                 (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                  *)&local_188,
                 (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)args);
      if (local_e8._M_string_length != local_c8._M_string_length) goto LAB_002106c5;
      if (local_e8._M_string_length == 0) {
        bVar10 = true;
      }
      else {
        iVar6 = bcmp(local_e8._M_dataplus._M_p,local_c8._M_dataplus._M_p,local_e8._M_string_length);
        bVar10 = iVar6 == 0;
      }
    }
    else {
LAB_002106c5:
      bVar10 = false;
    }
    if ((ProcessorBase *)uVar4 == processor) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      local_188.numActive = 0;
      if (4 < local_188.numAllocated) {
        if (local_188.items != (pool_ref<soul::AST::Expression> *)0x0) {
          operator_delete__(local_188.items);
        }
        local_188.items = (pool_ref<soul::AST::Expression> *)local_188.space;
        local_188.numAllocated = 4;
      }
    }
    if (bVar10) {
      if (((pool_ptr<soul::AST::Connection::SharedEndpoint> *)(local_148._0_8_ + 0x58))->object ==
          (SharedEndpoint *)0x0) {
        CompileMessageHelpers::createMessage<soul::Identifier&>
                  (&local_68,(CompileMessageHelpers *)0x1,none,0x2abfa5,
                   (char *)&(processor->super_ModuleBase).name,in_R9);
        AST::Context::throwError(c,&local_68,false);
      }
      if (((pool_ptr<soul::AST::Connection::SharedEndpoint> *)(local_148._0_8_ + 0x58))->object !=
          (this->currentConnectionEndpoint).object) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,
                   "An implicitly-created processor cannot be used more than once: create a named instance instead"
                  );
        AST::Context::throwError(c,&local_a0,false);
      }
      args = this;
      unaff_R12 = PoolAllocator::
                  allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorInstance>&>
                            (&((this->super_ModuleInstanceResolver).
                               super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,
                             (pool_ref<soul::AST::ProcessorInstance> *)local_148);
    }
    if (bVar10) break;
    ppVar2 = ppVar2 + 1;
    bVar9 = ppVar2 == local_f8;
  }
  if (bVar9) {
    newInstance = PoolAllocator::allocate<soul::AST::ProcessorInstance,soul::AST::Context&>
                            (&((this->super_ModuleInstanceResolver).
                               super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c);
    ppVar5 = local_108;
    this_01 = local_150;
    if (local_108->object == (Expression *)0x0) {
      pUVar7 = PoolAllocator::
               allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                         (&((this->super_ModuleInstanceResolver).
                            super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,
                          &(processor->super_ModuleBase).name);
      (newInstance->instanceName).object = pUVar7;
    }
    else {
      __rhs = (processor->super_ModuleBase).name.name;
      if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        throwInternalCompilerError("isValid()","toString",0x23);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     "_instance_",__rhs);
      AST::Scope::makeUniqueName
                ((string *)local_148,&(this_01->super_ProcessorBase).super_ModuleBase.super_Scope,
                 (string *)local_128);
      if ((ProcessorBase *)local_128._0_8_ != (ProcessorBase *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      this_00 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                allocator;
      newString._M_str = (char *)local_148._0_8_;
      newString._M_len = local_148._8_8_;
      local_128._0_8_ = Identifier::Pool::get(&this_00->identifiers,newString);
      pUVar7 = PoolAllocator::
               allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
                         (&this_00->pool,c,(Identifier *)local_128);
      (newInstance->instanceName).object = pUVar7;
      this_01 = local_150;
      if ((ProcessorInstance *)local_148._0_8_ != (ProcessorInstance *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        this_01 = local_150;
      }
    }
    pPVar8 = PoolAllocator::
             allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                       (&((this->super_ModuleInstanceResolver).
                          super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,processor);
    (newInstance->targetProcessor).object = &pPVar8->super_Expression;
    (newInstance->specialisationArgs).object = ppVar5->object;
    (newInstance->implicitInstanceSource).object = (this->currentConnectionEndpoint).object;
    AST::Graph::addProcessorInstance(this_01,newInstance);
    unaff_R12 = PoolAllocator::
                allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::AST::ProcessorInstance&>
                          (&((this->super_ModuleInstanceResolver).
                             super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,newInstance);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return unaff_R12;
}

Assistant:

AST::ProcessorInstanceRef& getOrCreateImplicitProcessorInstance (AST::Context& c,
                                                                         AST::ProcessorBase& processor,
                                                                         pool_ptr<AST::Expression> arguments)
        {
            auto signature = ASTUtilities::getSpecialisationSignature (processor.specialisationParams,
                                                                       AST::CommaSeparatedList::getAsExpressionList (arguments));

            auto currentGraph = cast<AST::Graph> (currentModule);
            SOUL_ASSERT (currentGraph != nullptr);

            for (auto i : currentGraph->processorInstances)
            {
                if (i->targetProcessor->getAsProcessor() == processor
                     && signature == ASTUtilities::getSpecialisationSignature (processor.specialisationParams,
                                                                               AST::CommaSeparatedList::getAsExpressionList (i->specialisationArgs)))
                {
                    if (i->implicitInstanceSource == nullptr)
                        c.throwError (Errors::cannotUseProcessorInLet (processor.name));

                    if (i->implicitInstanceSource != currentConnectionEndpoint)
                        c.throwError (Errors::cannotReuseImplicitProcessorInstance());

                    return allocator.allocate<AST::ProcessorInstanceRef> (c, i);
                }
            }

            auto& i = allocator.allocate<AST::ProcessorInstance> (c);

            if (arguments == nullptr)
            {
                i.instanceName = allocator.allocate<AST::UnqualifiedName> (c, processor.name);
            }
            else
            {
                auto name = currentGraph->makeUniqueName ("_instance_" + processor.name.toString());
                i.instanceName = allocator.allocate<AST::UnqualifiedName> (c, allocator.get (name));
            }

            i.targetProcessor = allocator.allocate<AST::ProcessorRef> (c, processor);
            i.specialisationArgs = arguments;
            i.implicitInstanceSource = currentConnectionEndpoint;
            currentGraph->addProcessorInstance (i);
            return allocator.allocate<AST::ProcessorInstanceRef> (c, i);
        }